

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PixelToasterUnix.h
# Opt level: O2

int __thiscall PixelToaster::UnixDisplay::open(UnixDisplay *this,char *__file,int __oflag,...)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  Listener *pLVar6;
  int iVar7;
  uint uVar8;
  Display *pDVar9;
  Converter *pCVar10;
  Converter *pCVar11;
  Window WVar12;
  Atom AVar13;
  XImage *pXVar14;
  undefined4 extraout_var;
  int in_ECX;
  uint uVar15;
  ulong uVar16;
  Format destination;
  int iVar17;
  long lVar18;
  bool bVar19;
  XSizeHints sizeHints;
  XSetWindowAttributes attributes;
  
  DisplayAdapter::open(&this->super_DisplayAdapter,__file,__oflag);
  pDVar9 = (Display *)XOpenDisplay(0);
  this->display_ = pDVar9;
  if (pDVar9 == (Display *)0x0) goto LAB_001096b4;
  lVar2 = *(long *)(pDVar9 + 0xe8);
  lVar18 = (long)*(int *)(pDVar9 + 0xe0) * 0x80;
  lVar3 = *(long *)(lVar2 + 0x40 + lVar18);
  if (lVar3 == 0) goto LAB_001096b4;
  lVar1 = lVar2 + lVar18;
  uVar8 = *(uint *)(lVar1 + 0x38);
  uVar16 = 0x20;
  if (uVar8 != 0x18) {
    uVar16 = (ulong)uVar8;
  }
  uVar15 = (uint)uVar16;
  destination.enumeration = XBGR1555;
  iVar17 = (int)(uVar15 + 7) / 8;
  if ((0x20 < uVar15) || ((0x1fe01fe00U >> (uVar16 & 0x3f) & 1) == 0)) goto LAB_001096b4;
  lVar4 = *(long *)(lVar3 + 0x18);
  lVar5 = *(long *)(lVar3 + 0x20);
  uVar16 = *(ulong *)(lVar3 + 0x28);
  if (uVar15 == 0x20) {
    if (((lVar5 == 0xff00) && (lVar4 == 0xff0000)) && (uVar16 == 0xff)) {
      destination.enumeration = XRGB8888;
    }
    else if (((lVar5 != 0xff00) || (lVar4 != 0xff)) ||
            (destination.enumeration = XBGR8888, uVar16 != 0xff0000)) goto LAB_00109424;
  }
  else if (uVar15 == 0x18) {
    if (((lVar5 == 0xff00) && (lVar4 == 0xff0000)) && (uVar16 == 0xff)) {
      destination.enumeration = RGB888;
    }
    else {
      if (((lVar5 != 0xff00) || (lVar4 != 0xff)) || (uVar16 != 0xff0000)) goto LAB_00109424;
      destination.enumeration = BGR888;
    }
  }
  else if (uVar15 == 0x10) {
    if ((lVar5 == 0x3e0 && lVar4 == 0x7c00) && (uVar16 ^ 0x1f) == 0) {
      destination.enumeration = XRGB1555;
    }
    else if (((lVar4 != 0x1f) || (lVar5 != 0x3e0)) || (uVar16 != 0x7c00)) {
      if ((lVar5 == 0x7e0 && lVar4 == 0xf800) && (uVar16 ^ 0x1f) == 0) {
        destination.enumeration = RGB565;
      }
      else {
        if (((lVar4 != 0x1f) || (lVar5 != 0x7e0)) || (uVar16 != 0xf800)) goto LAB_00109424;
        destination.enumeration = BGR565;
      }
    }
  }
  else {
LAB_00109424:
    destination.enumeration = Unknown;
  }
  (this->destFormat_).enumeration = destination.enumeration;
  pCVar10 = requestConverter((Format)0x9,destination);
  this->floatingPointConverter_ = pCVar10;
  pCVar11 = requestConverter((Format)0x1,destination);
  this->trueColorConverter_ = pCVar11;
  if (pCVar10 != (Converter *)0x0 && pCVar11 != (Converter *)0x0) {
    attributes.background_pixel = *(unsigned_long *)(lVar2 + 0x60 + lVar18);
    attributes.backing_store = 0;
    attributes.border_pixel = attributes.background_pixel;
    WVar12 = XCreateWindow(pDVar9,*(undefined8 *)(lVar2 + 0x10 + lVar18),
                           (long)(*(int *)(lVar1 + 0x18) - __oflag) / 2 & 0xffffffff,
                           (long)(*(int *)(lVar1 + 0x1c) - in_ECX) / 2 & 0xffffffff,__oflag,in_ECX,0
                           ,uVar8,1,lVar3,0x4a,&attributes);
    this->window_ = WVar12;
    XStoreName(this->display_,WVar12,__file);
    AVar13 = XInternAtom(this->display_,"WM_PROTOCOLS",1);
    this->wmProtocols_ = AVar13;
    AVar13 = XInternAtom(this->display_,"WM_DELETE_WINDOW",1);
    this->wmDeleteWindow_ = AVar13;
    if ((AVar13 != 0 && this->wmProtocols_ != 0) &&
       (iVar7 = XSetWMProtocols(this->display_,this->window_,&this->wmDeleteWindow_,1), iVar7 != 0))
    {
      XSetNormalHints(this->display_,this->window_);
      XClearWindow(this->display_,this->window_);
      XSelectInput(this->display_,this->window_,0x204f);
      DirtyVector<char>::reset(&this->buffer_,(long)(in_ECX * __oflag * iVar17));
      bVar19 = (this->buffer_).data_ == (char *)0x0;
      uVar15 = (uint)!bVar19;
      if (bVar19) {
        (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])(this);
        return uVar15;
      }
      this->gc_ = *(GC *)(*(long *)(this->display_ + 0xe8) + 0x48 + lVar18);
      pXVar14 = (XImage *)
                XCreateImage(this->display_,0,uVar8,2,0,0,__oflag,in_ECX,iVar17 * 8,iVar17 * __oflag
                            );
      this->image_ = pXVar14;
      pXVar14->byte_order = 0;
      XMapRaised(this->display_,this->window_);
      XFlush(this->display_);
      pLVar6 = (this->super_DisplayAdapter)._listener;
      if (pLVar6 == (Listener *)0x0) {
        return uVar15;
      }
      iVar17 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                         (this);
      if (CONCAT44(extraout_var,iVar17) != 0) {
        uVar8 = (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[0x10])
                          (this);
        this = (UnixDisplay *)(ulong)uVar8;
      }
      (**(code **)(*(long *)pLVar6 + 0x50))(pLVar6,this);
      return uVar15;
    }
  }
LAB_001096b4:
  (*(this->super_DisplayAdapter).super_DisplayInterface._vptr_DisplayInterface[3])(this);
  return 0;
}

Assistant:

bool open(const char title[], int width, int height, Output output, Mode mode) override
    {
        DisplayAdapter::open(title, width, height, output, mode);

        // let's open a display

        display_ = ::XOpenDisplay(0);
        if (!display_)
        {
            close();
            return false;
        }

        const int screen = DefaultScreen(display_);
        ::Visual* visual = DefaultVisual(display_, screen);
        if (!visual)
        {
            close();
            return false;
        }

        // It gets messy when talking about color depths.
        //
        // For the image buffer, we either need 8, 16 or 32 bitsPerPixel.  8 bits we'll
        // never have (hopefully), 16 bits will be used for displayDepth 15 & 16, and
        // 32 bits must be used for depths 24 and 32.
        //
        // The converters will get this right when talking about displayDepth 15 & 16, but
        // it will wrongly assume that displayDepth 24 takes _exactly_ 24 bitsPerPixel.  We
        // solve that by tricking the converter requester by presenting it a 32 bit
        // bufferDepth instead.
        //
        const int displayDepth  = DefaultDepth(display_, screen);
        const int bufferDepth   = displayDepth == 24 ? 32 : displayDepth;
        const int bytesPerPixel = (bufferDepth + 7) / 8;
        const int bitsPerPixel  = 8 * bytesPerPixel;
        if (bitsPerPixel != 16 && bitsPerPixel != 32)
        {
            close();
            return false;
        }

        destFormat_             = findFormat(bufferDepth,
                                 visual->red_mask, visual->green_mask, visual->blue_mask);
        floatingPointConverter_ = requestConverter(Format::XBGRFFFF, destFormat_);
        trueColorConverter_     = requestConverter(Format::XRGB8888, destFormat_);
        if (!floatingPointConverter_ || !trueColorConverter_)
        {
            close();
            return false;
        }

        // let's create a window

        const Window root = DefaultRootWindow(display_);

        const int screenWidth  = DisplayWidth(display_, screen);
        const int screenHeight = DisplayHeight(display_, screen);
        const int left         = (screenWidth - width) / 2;
        const int top          = (screenHeight - height) / 2;

        ::XSetWindowAttributes attributes;
        attributes.border_pixel = attributes.background_pixel = BlackPixel(display_, screen);
        attributes.backing_store                              = NotUseful;

        window_ = ::XCreateWindow(display_, root, left, top, width, height, 0,
                                  displayDepth, InputOutput, visual,
                                  CWBackPixel | CWBorderPixel | CWBackingStore, &attributes);

        ::XStoreName(display_, window_, title);

        wmProtocols_    = XInternAtom(display_, "WM_PROTOCOLS", True);
        wmDeleteWindow_ = XInternAtom(display_, "WM_DELETE_WINDOW", True);
        if (wmProtocols_ == 0 || wmDeleteWindow_ == 0)
        {
            close();
            return false;
        }
        if (::XSetWMProtocols(display_, window_, &wmDeleteWindow_, 1) == 0)
        {
            close();
            return false;
        }

        ::XSizeHints sizeHints;
        sizeHints.flags = PPosition | PMinSize | PMaxSize;
        sizeHints.x = sizeHints.y = 0;
        sizeHints.min_width = sizeHints.max_width = width;
        sizeHints.min_height = sizeHints.max_height = height;
        ::XSetNormalHints(display_, window_, &sizeHints);
        ::XClearWindow(display_, window_);
        ::XSelectInput(display_, window_, eventMask_);

        // create (image) buffer

        buffer_.reset(width * height * bytesPerPixel);
        if (buffer_.isEmpty())
        {
            close();
            return false;
        }

        gc_    = DefaultGC(display_, screen);
        image_ = ::XCreateImage(display_, CopyFromParent, displayDepth, ZPixmap, 0, 0,
                                width, height, bitsPerPixel, width * bytesPerPixel);
#if defined(PIXELTOASTER_LITTLE_ENDIAN)
        image_->byte_order = LSBFirst;
#else
        image_->byte_order = MSBFirst;
#endif
        if (!image_)
        {
            close();
            return false;
        }

        // we have a winner!

        ::XMapRaised(display_, window_);
        ::XFlush(display_);

        if (DisplayAdapter::listener())
            DisplayAdapter::listener()->onOpen(wrapper() ? *wrapper() : *(DisplayInterface*)this);

        return true;
    }